

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O2

int __thiscall TPZInterpolatedElement::NSideShapeF(TPZInterpolatedElement *this,int side)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))();
  iVar5 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    uVar2 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                      (this,iVar6,side);
    lVar4 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                      (this,uVar2);
    uVar2 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                      (this,iVar6,side);
    iVar3 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x260))
                      (this,uVar2,*(undefined1 *)(lVar4 + 0x14));
    iVar5 = iVar5 + iVar3;
  }
  return iVar5;
}

Assistant:

int TPZInterpolatedElement::NSideShapeF(int side) const {
    int ns = NSideConnects(side);
    int in, res = 0;
    for (in = 0; in < ns; in++) {
        TPZConnect &c = Connect(SideConnectLocId(in, side));
        res += NConnectShapeF(SideConnectLocId(in, side), c.Order());
    }
    return res;
}